

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateProgramOutputBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask,bool includeEmpty,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
               *genCase)

{
  deInt32 *pdVar1;
  ShaderType SVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  Node *pNVar5;
  SharedPtr variable_1;
  SharedPtr variable;
  SharedPtr variable_2;
  SharedPtr local_88;
  SharedPtr local_78;
  SharedPtr local_68;
  Context *local_58;
  TestCaseGroup *local_50;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr *local_48;
  Node *local_40;
  SharedPtrStateBase *local_38;
  
  pNVar3 = parentStructure->m_ptr;
  local_58 = context;
  local_50 = targetGroup;
  local_48 = genCase;
  if (pNVar3->m_type == TYPE_DEFAULT_BLOCK) {
    pNVar5 = (Node *)operator_new(0x28);
    pSVar4 = parentStructure->m_state;
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = pNVar3;
    (pNVar5->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 1;
    local_40 = pNVar5;
    local_38 = (SharedPtrStateBase *)operator_new(0x20);
    local_38->strongRefCount = 0;
    local_38->weakRefCount = 0;
    local_38->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_38[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    local_38->strongRefCount = 1;
    local_38->weakRefCount = 1;
    SVar2 = getShaderMaskLastStage(presentShadersMask);
    if (includeEmpty) {
      (*local_48)(local_58,parentStructure,local_50,PROGRAMINTERFACE_PROGRAM_OUTPUT,"empty");
    }
    if ((SVar2 == SHADERTYPE_TESSELLATION_EVALUATION) ||
       ((SVar2 & ~SHADERTYPE_GEOMETRY) == SHADERTYPE_VERTEX)) goto LAB_0157b7f1;
    if (SVar2 != SHADERTYPE_TESSELLATION_CONTROL) {
      if (SVar2 != SHADERTYPE_FRAGMENT) goto LAB_0157bc0a;
      pNVar3 = (Node *)operator_new(0x28);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar3->m_type = TYPE_VARIABLE;
      (pNVar3->m_enclosingNode).m_ptr = local_40;
      (pNVar3->m_enclosingNode).m_state = local_38;
      if (local_38 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_38->strongRefCount = local_38->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
      *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar3;
      local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_78.m_state)->strongRefCount = 0;
      (local_78.m_state)->weakRefCount = 0;
      (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      (local_78.m_state)->strongRefCount = 1;
      (local_78.m_state)->weakRefCount = 1;
      (*local_48)(local_58,&local_78,local_50,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var");
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_78.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_78.m_ptr = (Node *)0x0;
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_78.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      pNVar3 = (Node *)operator_new(0x28);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar3->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar3->m_enclosingNode).m_ptr = local_40;
      (pNVar3->m_enclosingNode).m_state = local_38;
      if (local_38 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_38->strongRefCount = local_38->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
      *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar3;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      local_78.m_state = pSVar4;
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar5->m_type = TYPE_VARIABLE;
      (pNVar5->m_enclosingNode).m_ptr = pNVar3;
      (pNVar5->m_enclosingNode).m_state = pSVar4;
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar5;
      local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_88.m_state)->strongRefCount = 0;
      (local_88.m_state)->weakRefCount = 0;
      (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      (local_88.m_state)->strongRefCount = 1;
      (local_88.m_state)->weakRefCount = 1;
      (*local_48)(local_58,&local_88,local_50,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var_array");
      goto LAB_0157bb8f;
    }
    pNVar5 = (Node *)operator_new(0x28);
    pNVar3 = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = pNVar3;
    (pNVar5->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 6;
    local_78.m_ptr = pNVar5;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = local_40;
    (pNVar3->m_enclosingNode).m_state = local_38;
    if (local_38 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_38->strongRefCount = local_38->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xfffffffe;
    local_88.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar3;
    (pNVar5->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar5;
    local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_68.m_state)->strongRefCount = 0;
    (local_68.m_state)->weakRefCount = 0;
    (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_68.m_state)->strongRefCount = 1;
    (local_68.m_state)->weakRefCount = 1;
    (*local_48)(local_58,&local_68,local_50,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var");
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_68.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_68.m_ptr = (Node *)0x0;
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_68.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar4 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar1 = &pSVar4->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_88.m_state)->strongRefCount = 0;
    (local_88.m_state)->weakRefCount = 0;
    (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    (local_88.m_state)->strongRefCount = 1;
    (local_88.m_state)->weakRefCount = 1;
    (*local_48)(local_58,&local_88,local_50,PROGRAMINTERFACE_PROGRAM_OUTPUT,"patch_var");
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_88.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x20);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_STRUCT_MEMBER;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b498;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar3;
    (pNVar5->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar5;
    local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_68.m_state)->strongRefCount = 0;
    (local_68.m_state)->weakRefCount = 0;
    (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_68.m_state)->strongRefCount = 1;
    (local_68.m_state)->weakRefCount = 1;
    (*local_48)(local_58,&local_68,local_50,PROGRAMINTERFACE_PROGRAM_OUTPUT,"patch_var_struct");
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_68.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_68.m_ptr = (Node *)0x0;
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_68.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar4 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar1 = &pSVar4->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar3;
    (pNVar5->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar5;
    local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_68.m_state)->strongRefCount = 0;
    (local_68.m_state)->weakRefCount = 0;
    (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_68.m_state)->strongRefCount = 1;
    (local_68.m_state)->weakRefCount = 1;
    (*local_48)(local_58,&local_68,local_50,PROGRAMINTERFACE_PROGRAM_OUTPUT,"patch_var_array");
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_68.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_68.m_ptr = (Node *)0x0;
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_68.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar4 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar1 = &pSVar4->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 != 0) goto LAB_0157bbcd;
      goto LAB_0157bbbd;
    }
  }
  else {
    local_38 = parentStructure->m_state;
    local_40 = pNVar3;
    if (local_38 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_38->strongRefCount = local_38->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_38->weakRefCount = local_38->weakRefCount + 1;
      UNLOCK();
    }
LAB_0157b7f1:
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = local_40;
    (pNVar3->m_enclosingNode).m_state = local_38;
    if (local_38 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_38->strongRefCount = local_38->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar3;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    (*local_48)(local_58,&local_78,local_50,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var");
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_78.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_78.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x20);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_STRUCT_MEMBER;
    (pNVar3->m_enclosingNode).m_ptr = local_40;
    (pNVar3->m_enclosingNode).m_state = local_38;
    if (local_38 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_38->strongRefCount = local_38->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b498;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_78.m_state = pSVar4;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar3;
    (pNVar5->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_88.m_state)->strongRefCount = 0;
    (local_88.m_state)->weakRefCount = 0;
    (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_88.m_state)->strongRefCount = 1;
    (local_88.m_state)->weakRefCount = 1;
    (*local_48)(local_58,&local_88,local_50,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var_struct");
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_88.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar4 = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_78.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
      }
      LOCK();
      pdVar1 = &pSVar4->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = local_40;
    (pNVar3->m_enclosingNode).m_state = local_38;
    if (local_38 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_38->strongRefCount = local_38->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_78.m_state = pSVar4;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar3;
    (pNVar5->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_88.m_state)->strongRefCount = 0;
    (local_88.m_state)->weakRefCount = 0;
    (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_88.m_state)->strongRefCount = 1;
    (local_88.m_state)->weakRefCount = 1;
    (*local_48)(local_58,&local_88,local_50,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var_array");
LAB_0157bb8f:
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_88.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
LAB_0157bbbd:
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
    }
  }
LAB_0157bbcd:
  pSVar4 = local_78.m_state;
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_78.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar1 = &pSVar4->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
LAB_0157bc0a:
  pSVar4 = local_38;
  if (local_38 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_38->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_40 = (Node *)0x0;
      (*local_38->_vptr_SharedPtrStateBase[2])(local_38);
    }
    LOCK();
    pdVar1 = &pSVar4->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_38 != (SharedPtrStateBase *)0x0)) {
      (*local_38->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateProgramOutputBlockContents (Context&										context,
												const ResourceDefinition::Node::SharedPtr&		parentStructure,
												tcu::TestCaseGroup*								targetGroup,
												deUint32										presentShadersMask,
												bool											includeEmpty,
												void											(*genCase)(Context&										context,
																										   const ResourceDefinition::Node::SharedPtr&	parentStructure,
																										   tcu::TestCaseGroup*							targetGroup,
																										   ProgramInterface								interface,
																										   const char*									name))
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	output			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_OUT)))
																	: (parentStructure);
	const glu::ShaderType						lastStage		= getShaderMaskLastStage(presentShadersMask);

	// .empty
	if (includeEmpty && inDefaultBlock)
		genCase(context, parentStructure, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "empty");

	if (lastStage == glu::SHADERTYPE_VERTEX						||
		lastStage == glu::SHADERTYPE_GEOMETRY					||
		lastStage == glu::SHADERTYPE_TESSELLATION_EVALUATION	||
		!inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var");
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var_struct");
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var_array");
		}
	}
	else if (lastStage == glu::SHADERTYPE_FRAGMENT)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var");
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var_array");
		}
	}
	else if (lastStage == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchOutput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_OUT));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var");
		}
		// extension forbids use arrays of structs
		// extension forbids use array of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchOutput, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "patch_var");
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "patch_var_struct");
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "patch_var_array");
		}
	}
	else if (lastStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}